

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

Status __thiscall mognetwork::TcpSocket::readPendingDatas(TcpSocket *this)

{
  undefined8 uVar1;
  ulong uVar2;
  void *pvVar3;
  undefined8 *puVar4;
  long lVar5;
  long in_RDI;
  Status status;
  vector<char,_std::allocator<char>_> *in_stack_00000068;
  vector<char,_std::allocator<char>_> *in_stack_00000070;
  char *in_stack_000001c8;
  int in_stack_000001d4;
  char *in_stack_000001d8;
  LibNetworkException *in_stack_000001e0;
  Status local_4;
  
  if (*(long *)(in_RDI + 0x98) != 0) {
    local_4 = (**(code **)(**(long **)(in_RDI + 0x98) + 0x10))();
    uVar2 = (**(code **)(**(long **)(in_RDI + 0x98) + 0x18))();
    if ((uVar2 & 1) != 0) {
      pvVar3 = operator_new(0x28);
      ReadedDatas::ReadedDatas((ReadedDatas *)0x11e5fd);
      *(void **)(in_RDI + 0x50) = pvVar3;
      (**(code **)(**(long **)(in_RDI + 0x98) + 0x30))();
      std::vector<char,_std::allocator<char>_>::operator=(in_stack_00000070,in_stack_00000068);
      puVar4 = (undefined8 *)(**(code **)(**(long **)(in_RDI + 0x98) + 0x30))();
      **(undefined8 **)(in_RDI + 0x50) = *puVar4;
      lVar5 = (**(code **)(**(long **)(in_RDI + 0x98) + 0x30))();
      *(undefined4 *)(*(long *)(in_RDI + 0x50) + 8) = *(undefined4 *)(lVar5 + 8);
      (**(code **)(**(long **)(in_RDI + 0x98) + 0x38))();
      local_4 = Ok;
    }
    return local_4;
  }
  uVar1 = __cxa_allocate_exception(0x28);
  LibNetworkException::LibNetworkException
            (in_stack_000001e0,in_stack_000001d8,in_stack_000001d4,in_stack_000001c8);
  __cxa_throw(uVar1,&LibNetworkException::typeinfo,LibNetworkException::~LibNetworkException);
}

Assistant:

Socket::Status TcpSocket::readPendingDatas()
  {
    if (m_protocolListener == NULL)
      throw LibNetworkException("No protocol listener found.", __LINE__, __FILE__);

    Socket::Status status = m_protocolListener->onReadTrigger();

    if (m_protocolListener->datasFullyReceived())
      {
	m_allDataReaded = new ReadedDatas();
	m_allDataReaded->datas = m_protocolListener->getReadedDatas().datas;
	m_allDataReaded->readed = m_protocolListener->getReadedDatas().readed;
	m_allDataReaded->totalSize = m_protocolListener->getReadedDatas().totalSize;
	m_protocolListener->flushReader();
	return (Ok);
      }
    return status;
  }